

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.cpp
# Opt level: O1

bool ReadDSK(MemFile *file,shared_ptr<Disk> *disk)

{
  uchar *args_1;
  byte bVar1;
  element_type *peVar2;
  Disk *pDVar3;
  pointer puVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  it;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  itEnd;
  _Any_data *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  char cVar7;
  char extraout_AL;
  Merge MVar8;
  int iVar9;
  int iVar10;
  ssize_t sVar11;
  mapped_type *pmVar12;
  Sector *this;
  undefined4 extraout_var;
  Data *pDVar13;
  exception *peVar14;
  uint uVar15;
  size_t in_RCX;
  DataRate *args_1_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar16;
  undefined7 uVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  size_type __n;
  char cVar21;
  MemFile *this_00;
  int iVar22;
  bool bVar23;
  uint8_t status2;
  uint8_t status1;
  uint8_t heads;
  uint8_t cyls;
  EDSK_OFFSETS eo;
  int uTrackSize;
  CylHead cylhead;
  Data data;
  size_t uTail;
  Track track;
  uint8_t ab [256];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_280;
  int local_264;
  undefined3 local_260;
  undefined5 uStack_25d;
  short local_258;
  undefined1 uStack_256;
  byte local_253;
  uchar local_252;
  uchar local_251;
  byte local_250;
  byte local_24f;
  byte local_24e;
  uchar local_24d;
  byte local_24c;
  byte local_24b;
  char local_24a;
  uint local_248;
  uint local_244;
  shared_ptr<Disk> *local_240;
  CylHead local_238;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_230;
  uint8_t *local_218;
  char *local_210;
  int local_204;
  DataRate local_200;
  uint local_1fc;
  _Any_data local_1f8;
  shared_ptr<Disk> local_1e8;
  vector<Data,_std::allocator<Data>_> local_1d0;
  _Any_data local_1b8;
  _Any_data local_1a8;
  Encoding local_194;
  int local_190;
  uint local_18c;
  key_type local_188;
  ulong local_168;
  key_type local_160;
  size_type local_140;
  char local_138;
  undefined7 uStack_137;
  short local_130;
  byte local_128;
  byte local_127;
  char local_123;
  undefined6 local_116;
  undefined2 uStack_110;
  undefined6 uStack_10e;
  byte local_108;
  byte local_107;
  ushort local_106;
  byte abStack_104 [212];
  
  local_240 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar11 = MemFile::read(file,(int)&local_138,(void *)0x100,in_RCX), cVar7 = local_138,
      (char)sVar11 == '\0')) ||
     ((CONCAT71(uStack_137,local_138) != 0x4445444e45545845 &&
      (CONCAT71(uStack_137,local_138) != 0x435043202d20564d)))) {
    return false;
  }
  if ((char)local_107 < '\0') {
    Message<>(msgWarning,"ignoring deprecated \'random data errors\' flag");
    local_107 = local_107 & 0x7f;
  }
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._3_1_ = local_108;
  local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._2_1_ = local_107;
  if (local_107 < 3) {
    local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)file;
    if (local_108 < 0x67) {
      args_1_00 = (DataRate *)CONCAT62(uStack_10e,uStack_110);
      local_1a8._0_6_ = local_116;
      local_1a8._6_2_ = uStack_110;
      local_1b8._8_8_ = 0xe;
      local_1a8._M_pod_data[0xe] = '\0';
      local_1b8._M_unused._M_object = &local_1a8;
      util::trim((string *)&local_1f8,(string *)&local_1b8);
      peVar2 = (local_240->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"creator","");
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar2->metadata,&local_188);
      std::__cxx11::string::operator=((string *)pmVar12,(string *)local_1f8._M_pod_data);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((shared_ptr<Disk> *)local_1f8._M_unused._0_8_ != &local_1e8) {
        operator_delete(local_1f8._M_unused._M_object,
                        (ulong)((long)&(local_1e8.
                                        super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                                       ->_vptr_Disk + 1));
      }
      if ((_Any_data *)local_1b8._M_unused._0_8_ != &local_1a8) {
        operator_delete(local_1b8._M_unused._M_object,CONCAT26(local_1a8._6_2_,local_1a8._0_6_) + 1)
        ;
      }
      local_218 = AllocMem(0xff00);
      this_00 = (MemFile *)
                local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      if (local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._3_1_ != 0) {
        local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_168 = 0;
        do {
          if (local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start._2_1_ != 0) {
            uVar15 = 0;
            do {
              local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = uVar15;
              CylHead::CylHead(&local_238,
                               (int)local_280.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                               local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_);
              local_204 = MemFile::tell(this_00);
              if (cVar7 == 'E') {
                args_1_00 = (DataRate *)
                            ((ulong)local_280.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_ +
                            (ulong)(local_280.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._2_1_ *
                                   (uint)local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish));
                local_244 = (uint)abStack_104[(long)args_1_00] << 8;
                if (abStack_104[(long)args_1_00] != 0) goto LAB_0018c941;
                pDVar3 = (local_240->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                Track::Track((Track *)&local_1f8,0);
                Disk::write(pDVar3,(int)&local_238,&local_1f8,(size_t)args_1_00);
LAB_0018c934:
                p_Var5 = &local_1f8;
              }
              else {
                local_244 = (uint)local_106;
LAB_0018c941:
                if (0x27 < (uint)local_280.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish) {
                  iVar9 = MemFile::tell(this_00);
                  iVar10 = MemFile::size(this_00);
                  if (iVar9 == iVar10) {
                    local_1f8._M_unused._0_8_ =
                         (undefined8)
                         CH((int)local_280.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                            local_280.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_);
                    Message<char_const*>
                              (msgWarning,"%s track header is missing, assuming blank track",
                               (char **)&local_1f8);
                    pDVar3 = (local_240->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    Track::Track((Track *)&local_1f8,0);
                    Disk::write(pDVar3,(int)&local_238,&local_1f8,(size_t)args_1_00);
                    goto LAB_0018c934;
                  }
                }
                sVar11 = MemFile::read(this_00,(int)&local_260,(void *)0x18,(size_t)args_1_00);
                if ((char)sVar11 == '\0') {
                  peVar14 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[20],CylHead&>
                            (peVar14,(char (*) [20])"short file reading ",&local_238);
LAB_0018d6a8:
                  __cxa_throw(peVar14,&util::exception::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                if (local_258 != 0x6f66 || CONCAT53(uStack_25d,local_260) != 0x6e492d6b63617254) {
                  peVar14 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[28],CylHead&>
                            (peVar14,(char (*) [28])"track signature missing on ",&local_238);
                  goto LAB_0018d6a8;
                }
                if (7 < local_24c && cVar7 != 'E') {
                  local_1f8._M_unused._0_8_ = (undefined8)SizeStr((uint)local_24c);
                  local_1b8._M_unused._0_8_ =
                       (undefined8)
                       CH((int)local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish,
                          local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_);
                  Message<char_const*,char_const*>
                            (msgWarning,"invalid sector size code (%s) on %s",(char **)&local_1f8,
                             (char **)&local_1b8);
                }
                if (local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start._4_4_ != local_24f ||
                    (uint)local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish != (uint)local_250) {
                  if ((uint)local_280.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish == (uint)local_250) {
                    local_1f8._M_unused._0_8_ = (undefined8)HeadStr((uint)local_24f);
                    local_1b8._M_unused._0_8_ =
                         (undefined8)
                         HeadStr(local_280.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_);
                    Message<char_const*,char_const*>
                              (msgWarning,"header side %s != head %s",(char **)&local_1f8,
                               (char **)&local_1b8);
                  }
                  else {
                    local_1f8._M_unused._0_8_ = (undefined8)CylStr((uint)local_250);
                    local_1b8._M_unused._0_8_ =
                         (undefined8)
                         CylStr((int)local_280.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                    Message<char_const*,char_const*>
                              (msgWarning,"header track %s != cyl %s",(char **)&local_1f8,
                               (char **)&local_1b8);
                  }
                }
                if (local_253 != 0 && local_24e == 0) {
                  local_24e = local_253;
                  local_253 = 0;
                }
                if (local_252 != '\0' && local_24d == '\0') {
                  local_24d = local_252;
                  local_252 = '\0';
                }
                if (((local_253 != 0) || (local_252 != '\0')) || (local_251 != '\0')) {
                  local_1f8._M_unused._0_8_ =
                       (undefined8)
                       CH((int)local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish,
                          local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_);
                  Message<unsigned_char&,unsigned_char&,unsigned_char&,char_const*>
                            (msgWarning,"unused fields are non-zero (%02X %02X %02X) on %s",
                             &local_253,&local_252,&local_251,(char **)&local_1f8);
                }
                args_1_00 = (DataRate *)(ulong)(local_24e - 1);
                local_200 = _250K;
                if ((byte)(local_24e - 1) < 3) {
                  args_1_00 = ReadDSK::abEDSKRates;
                  local_200 = ReadDSK::abEDSKRates[local_24e];
                }
                bVar23 = local_24d == '\x01';
                Track::Track((Track *)&local_1b8,(uint)local_24b);
                uVar15 = (uint)local_24b;
                uVar18 = ((uint)local_24b * 8 + 0x117 & 0xf00) - 0x18;
                if ((int)(uVar15 * 8) < (int)uVar18) {
                  iVar9 = MemFile::size((MemFile *)
                                        local_280.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  iVar10 = MemFile::tell((MemFile *)
                                         local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  if (iVar9 - iVar10 != uVar15 * 8) goto LAB_0018cc21;
                  local_1f8._M_unused._0_8_ =
                       (undefined8)
                       CH((int)local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish,
                          local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_);
                  Message<char_const*>
                            (msgWarning,"%s track header is shorter than index size",
                             (char **)&local_1f8);
                }
                else {
LAB_0018cc21:
                  sVar11 = MemFile::read((MemFile *)
                                         local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (int)local_218,(void *)(ulong)uVar18,(size_t)args_1_00);
                  if ((char)sVar11 == '\0') {
                    peVar14 = (exception *)__cxa_allocate_exception(0x10);
                    util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[16]>
                              (peVar14,(char (*) [20])"short file reading ",&local_238,
                               (char (*) [16])" sector headers");
                    __cxa_throw(peVar14,&util::exception::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
                if (local_24b != 0) {
                  local_194 = bVar23 + MFM;
                  uVar19 = 0;
                  do {
                    Header::Header((Header *)&local_230,(uint)local_218[uVar19 * 8],
                                   (uint)local_218[uVar19 * 8 + 1],(uint)local_218[uVar19 * 8 + 2],
                                   (uint)local_218[uVar19 * 8 + 3]);
                    Sector::Sector((Sector *)&local_1f8,local_200,local_194,(Header *)&local_230,0);
                    _Var6._M_pi = local_1e8.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                    iVar9 = (int)uVar19;
                    if (iVar9 < (int)(local_24b - 1)) {
                      local_1e8.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._4_1_ = local_24a;
                      local_1e8.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi._5_3_ = 0;
                      if ((local_24a == 'R') || (local_24a == 'N')) {
                        local_1e8.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi = _Var6._M_pi & 0xffffffff;
                      }
                    }
                    local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start._1_1_ = local_218[uVar19 * 8 + 4];
                    bVar1 = local_218[uVar19 * 8 + 5];
                    local_248 = bVar1 & 0x20;
                    pvVar16 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
                    local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start._0_1_ = bVar1;
                    if ((bVar1 & 0x20) == 0) {
                      bVar20 = (local_280.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_1_ & 0x20) >> 5;
                      if ((local_280.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_1_ & 0x20) != 0) {
                        Sector::set_badidcrc((Sector *)&local_1f8,true);
                      }
                    }
                    else {
                      bVar20 = 0;
                    }
                    if (((local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._1_1_ & 0x20) != 0) &&
                       (((byte)local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start & 1) != 0)) {
                      pvVar16 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                (local_1f8._8_8_ & 0xffffffff);
                      local_230.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)CHSR((int)local_280.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,
                                         local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar9,
                                         local_1f8._8_4_);
                      Message<char_const*>
                                (msgWarning,"unsupported placeholder sector on %s",
                                 (char **)&local_230);
                      local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_1_ =
                           (byte)local_280.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start & 0xfe;
                    }
                    if (((local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._1_1_ & 0x4a) != 0) ||
                       (((byte)local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0x8c) != 0)) {
                      local_230.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)CHSR((int)local_280.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_finish,
                                         local_280.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar9,
                                         local_1f8._8_4_);
                      pvVar16 = &local_280;
                      Message<unsigned_char&,unsigned_char&,char_const*>
                                (msgWarning,"invalid status (ST1=%02X ST2=%02X) for %s",
                                 (uchar *)((long)&local_280.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1),
                                 (uchar *)pvVar16,(char **)&local_230);
                      local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._1_1_ =
                           local_280.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._1_1_ & 0xb5;
                      local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_1_ =
                           (byte)local_280.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start & 0x73;
                    }
                    uVar17 = (undefined7)((ulong)pvVar16 >> 8);
                    args_1_00 = (DataRate *)
                                CONCAT71(uVar17,(byte)local_280.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                    if ((local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_1_ != 0x80 ||
                        (byte)local_280.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start != 0) &&
                        ((byte)local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start != 0x40 &&
                         (byte)local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start != 0 ||
                        local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_1_ != 0)) {
                      if (((local_280.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._1_1_ != 0x20) ||
                          ((byte)local_280.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start != 0 &&
                           ((byte)local_280.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xbf) != 0x20)) &&
                         (1 < local_280.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_1_ ||
                          (byte)local_280.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != 1)) {
                        bVar23 = ((byte)local_280.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start & 0xef) == 0;
                        args_1_00 = (DataRate *)CONCAT71(uVar17,bVar23);
                        if ((local_280.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_1_ != 4) || (!bVar23)) {
                          local_230.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               (pointer)CHSR((int)local_280.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                             local_280.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar9,
                                             local_1f8._8_4_);
                          args_1_00 = (DataRate *)&local_280;
                          Message<unsigned_char&,unsigned_char&,char_const*>
                                    (msgWarning,"unusual status flags (ST1=%02X ST2=%02X) for %s",
                                     (uchar *)((long)&local_280.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 1),
                                     (uchar *)args_1_00,(char **)&local_230);
                        }
                      }
                    }
                    local_264 = Sector::size((Sector *)&local_1f8);
                    if (cVar7 == 'E') {
                      uVar15 = (uint)*(ushort *)(local_218 + uVar19 * 8 + 6);
                    }
                    else {
                      uVar15 = Sector::SizeCodeToLength((uint)local_24c);
                    }
                    uVar18 = bVar1 & 1 ^ 1;
                    if (((cVar7 == 'E') && (local_264 < (int)uVar15)) && (local_248 != 0)) {
                      args_1_00 = (DataRate *)((long)(int)uVar15 / (long)local_264 & 0xffffffff);
                      if ((uVar15 == 0xc000) || ((int)uVar15 % local_264 == 0)) {
                        if (uVar15 == 0xc000) {
                          args_1_00 = (DataRate *)0x3;
                        }
                        uVar18 = (uint)args_1_00;
                        uVar15 = (int)uVar15 / (int)uVar18;
                      }
                    }
                    if (0 < (int)uVar18) {
                      cVar21 = (char)(bVar1 & 1);
                      local_140 = (size_type)local_264;
                      local_190 = (uint)((bVar1 & 0x40) == 0) * 3 + 0xf8;
                      do {
                        __n = (size_type)(int)uVar15;
                        local_18c = uVar18;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                                  (&local_230,__n,(allocator_type *)&local_210);
                        iVar22 = (int)local_230.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                 (int)local_230.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                        iVar10 = MemFile::remaining((MemFile *)
                                                    local_280.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                        puVar4 = local_280.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                        if (iVar10 < iVar22) {
                          peVar14 = (exception *)__cxa_allocate_exception(0x10);
                          util::exception::
                          exception<char_const(&)[20],CylHead&,char_const(&)[9],int&>
                                    (peVar14,(char (*) [20])"short file reading ",&local_238,
                                     (char (*) [9])0x1b0f03,(int *)(local_1f8._M_pod_data + 8));
                          __cxa_throw(peVar14,&util::exception::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        memcpy(local_230.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               ((iterator *)
                               ((long)local_280.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x58))->
                               _M_current,(long)iVar22);
                        ((iterator *)((long)puVar4 + 0x58))->_M_current =
                             ((iterator *)((long)puVar4 + 0x58))->_M_current + iVar22;
                        args_1_00 = (DataRate *)(ulong)(uint)opt.fix;
                        if (opt.fix == 0) {
                          bVar23 = false;
                        }
                        else {
                          local_1fc = opt.fix;
                          peVar2 = (local_240->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)
                                   ._M_ptr;
                          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_160,"creator","");
                          pmVar12 = std::
                                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator[](&peVar2->metadata,&local_160);
                          std::__cxx11::string::substr((ulong)&local_188,(ulong)pmVar12);
                          iVar10 = std::__cxx11::string::compare((char *)&local_188);
                          bVar23 = false;
                          if (iVar10 == 0 && local_248 == 0) {
                            args_1_00 = (DataRate *)(ulong)local_1fc;
                            bVar23 = false;
                            if (local_264 < (int)uVar15) {
                              bVar23 = (int)uVar15 % local_264 == 0;
                            }
                          }
                          else {
                            args_1_00 = (DataRate *)(ulong)local_1fc;
                          }
                        }
                        if ((int)args_1_00 != 0) {
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_188._M_dataplus._M_p != &local_188.field_2) {
                            operator_delete(local_188._M_dataplus._M_p,
                                            local_188.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_160._M_dataplus._M_p != &local_160.field_2) {
                            operator_delete(local_160._M_dataplus._M_p,
                                            local_160.field_2._M_allocated_capacity + 1);
                          }
                        }
                        if (bVar23) {
                          args_1_00 = (DataRate *)(local_1f8._8_8_ & 0xffffffff);
                          local_210 = CHSR((int)local_280.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_finish,
                                           local_280.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar9,
                                           local_1f8._8_4_);
                          Message<char_const*>
                                    (msgFix,"dropping suspicious excess data on %s",&local_210);
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_230,local_140);
                        }
                        if (((local_248 != 0) && ((int)uVar15 % local_264 == 1)) &&
                           (local_230.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start[__n - 1] == '{')) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_230,__n - 1);
                          uVar15 = (uint)(__n - 1);
                        }
                        if (cVar7 == 'E') {
LAB_0018d104:
                          if (cVar21 == '\0' && bVar20 == 0) {
                            args_1_00 = (DataRate *)(ulong)(byte)local_190;
                            MVar8 = Sector::add((Sector *)&local_1f8,(Data *)&local_230,
                                                local_248 != 0,(byte)local_190);
                            if (MVar8 == Unchanged) {
                              args_1_00 = (DataRate *)(local_1f8._8_8_ & 0xffffffff);
                              local_210 = CHSR((int)local_280.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                               local_280.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar9
                                               ,local_1f8._8_4_);
                              Message<char_const*>
                                        (msgInfo,"ignored identical data copy of %s",&local_210);
                            }
                          }
                          else {
                            args_1_00 = (DataRate *)(local_1f8._8_8_ & 0xffffffff);
                            local_210 = CHSR((int)local_280.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                             local_280.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar9,
                                             local_1f8._8_4_);
                            Message<char_const*>
                                      (msgWarning,
                                       "ignoring stored data on %s, which has no data field",
                                       &local_210);
                          }
                        }
                        else if (cVar21 == '\0' && bVar20 == 0) {
                          if (local_264 < (int)uVar15) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_230,(long)(int)uVar15);
                          }
                          goto LAB_0018d104;
                        }
                        if (local_230.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_230.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_230.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_230.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        uVar18 = local_18c - 1;
                      } while (uVar18 != 0);
                    }
                    Track::add((Track *)&local_1b8,(Sector *)&local_1f8);
                    std::vector<Data,_std::allocator<Data>_>::~vector(&local_1d0);
                    uVar19 = uVar19 + 1;
                  } while (uVar19 < local_24b);
                }
                this_00 = (MemFile *)
                          local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                pvVar16 = &local_230;
                iVar9 = MemFile::tell((MemFile *)
                                      local_280.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
                MemFile::seek(this_00,local_244 + local_204);
                if (cVar7 == 'E') {
                  uVar15 = iVar9 + 0xffU & 0xffffff00;
                  uVar18 = uVar15 - local_204;
                  if (uVar18 != local_244) {
                    if ((uVar18 & 0xffff) == local_244) {
                      local_1f8._M_unused._0_8_ =
                           (undefined8)
                           CH((int)local_280.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                              local_280.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_);
                      local_230.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)CONCAT44(local_230.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar18)
                      ;
                      Message<char_const*,int,int&>
                                (msgWarning,"%s size (%u) does not match index entry (%u)",
                                 (char **)&local_1f8,(int *)pvVar16,(int *)&local_244);
                      MemFile::seek(this_00,uVar15);
                      args_1_00 = (DataRate *)pvVar16;
                    }
                    else {
                      local_1f8._M_unused._0_8_ =
                           (undefined8)
                           CH((int)local_280.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                              local_280.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_);
                      local_230.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start =
                           (pointer)CONCAT44(local_230.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar18)
                      ;
                      Message<char_const*,int,int&>
                                (msgWarning,"%s size (%u) does not match index entry (%u)",
                                 (char **)&local_1f8,(int *)pvVar16,(int *)&local_244);
                      args_1_00 = (DataRate *)pvVar16;
                    }
                  }
                }
                if (((local_168 & 1) == 0) &&
                   (bVar23 = Track::is_8k_sector((Track *)&local_1b8), bVar23)) {
                  this = Track::operator[]((Track *)&local_1b8,0);
                  iVar9 = Sector::data_size(this);
                  if (iVar9 == 0x1800) {
                    local_168 = CONCAT71((int7)(CONCAT44(extraout_var,iVar9) >> 8),1);
                    Message<>(msgWarning,"missing checksums needed to verify 8K sector integrity");
                  }
                }
                Disk::write((local_240->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                            ,(int)&local_238,&local_1b8,(size_t)args_1_00);
                p_Var5 = &local_1b8;
              }
              std::vector<Sector,_std::allocator<Sector>_>::~vector
                        ((vector<Sector,_std::allocator<Sector>_> *)(p_Var5->_M_pod_data + 8));
              uVar15 = local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_ + 1;
            } while (local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_ + 1 <
                     (uint)local_280.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._2_1_);
          }
          uVar15 = (int)local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish + 1;
          args_1_00 = (DataRate *)(ulong)uVar15;
          local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)args_1_00;
        } while (uVar15 < local_280.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start._3_1_);
      }
      if ((cVar7 == 'E') &&
         (sVar11 = MemFile::read(this_00,(int)&local_260,(void *)0xf,1), (int)sVar11 != 0)) {
        if (CONCAT17(uStack_256,CONCAT25(local_258,uStack_25d)) == 0x6f666e492d746573 &&
            CONCAT53(uStack_25d,local_260) == 0x492d74657366664f) {
          Range::Range((Range *)&local_1b8,
                       (uint)local_280.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._3_1_,
                       (uint)local_280.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._2_1_);
          local_1f8._M_unused._M_object = local_240;
          local_1e8.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dsk.cpp:368:37)>
               ::_M_invoke;
          local_1e8.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dsk.cpp:368:37)>
               ::_M_manager;
          local_1f8._8_8_ = this_00;
          Range::each((Range *)&local_1b8,(function<void_(const_CylHead_&)> *)&local_1f8,false);
          if (local_1e8.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            (*(code *)local_1e8.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      (&local_1f8,&local_1f8,3);
          }
        }
        else {
          iVar9 = MemFile::tell(this_00);
          MemFile::seek(this_00,iVar9 + -0xf);
        }
      }
      do {
        sVar11 = MemFile::read((MemFile *)
                               local_280.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(int)&local_138,
                               (void *)0x100,1);
        if ((int)sVar11 == 0) {
LAB_0018d50b:
          puVar4 = local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          iVar9 = MemFile::size((MemFile *)
                                local_280.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          iVar10 = MemFile::tell((MemFile *)puVar4);
          local_1f8._M_unused._0_8_ = (undefined8)(long)(iVar9 - iVar10);
          if (iVar9 - iVar10 != 0) {
            pDVar13 = MemFile::data((MemFile *)
                                    local_280.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            puVar4 = (pDVar13->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar9 = MemFile::tell((MemFile *)
                                  local_280.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
            args_1 = puVar4 + iVar9;
            iVar9 = bcmp(args_1,puVar4 + (long)iVar9 + 1,local_1f8._M_unused._M_member_pointer - 1);
            if (iVar9 == 0) {
              Message<unsigned_long&,unsigned_char_const&>
                        (msgWarning,"file ends with %u bytes of %02X filler",
                         (unsigned_long *)local_1f8._M_pod_data,args_1);
            }
            else {
              Message<unsigned_long&>
                        (msgWarning,"%u bytes of unused data found at end of file:",
                         (unsigned_long *)local_1f8._M_pod_data);
              pDVar13 = MemFile::data((MemFile *)
                                      local_280.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              it._M_current =
                   (pDVar13->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              pDVar13 = MemFile::data((MemFile *)
                                      local_280.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              itEnd._M_current =
                   (pDVar13->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              iVar9 = MemFile::tell((MemFile *)
                                    local_280.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
              util::
              hex_dump<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (it,itEnd,iVar9,(colour *)0x0,0x10);
            }
          }
          peVar2 = (local_240->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::_M_replace
                    ((ulong)&peVar2->strType,0,(char *)(peVar2->strType)._M_string_length,0x1b2341);
          FreeMem(local_218);
          return true;
        }
        if ((local_130 != 0x6f66 || CONCAT71(uStack_137,local_138) != 0x6e492d6b63617254) ||
           (local_123 != '\0')) {
          iVar9 = MemFile::tell((MemFile *)
                                local_280.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
          MemFile::seek((MemFile *)
                        local_280.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,iVar9 + -0x100);
          goto LAB_0018d50b;
        }
        local_1f8._M_unused._0_8_ = (undefined8)CH((uint)local_128,(uint)local_127);
        Message<char_const*>
                  (msgWarning,"blank %s should not have EDSK track block",(char **)&local_1f8);
      } while( true );
    }
    peVar14 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[25],unsigned_char&,char_const(&)[2]>
              (peVar14,(char (*) [25])"invalid cylinder count (",
               (uchar *)((long)&local_280.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 3),(char (*) [2])0x1aefa0
              );
  }
  else {
    peVar14 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[21],unsigned_char&,char_const(&)[2]>
              (peVar14,(char (*) [21])"invalid head count (",
               (uchar *)((long)&local_280.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + 2),(char (*) [2])0x1aefa0
              );
  }
  __cxa_throw(peVar14,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadDSK(MemFile& file, std::shared_ptr<Disk>& disk)
{
    uint8_t ab[256];
    if (!file.rewind() || !file.read(&ab, sizeof(ab)))
        return false;

    auto peh = reinterpret_cast<EDSK_HEADER*>(ab);
    if (memcmp(peh->szSignature, EDSK_SIGNATURE, 8) &&  // match: "EXTENDED" only
        memcmp(peh->szSignature, DSK_SIGNATURE, 8)) // match: "MV - CPC"
        return false;

    auto pbIndex = reinterpret_cast<const uint8_t*>(peh + 1);
    auto max_cyls = (sizeof(ab) - sizeof(EDSK_HEADER)) / MAX_SIDES;
    bool fEDSK = peh->szSignature[0] == EDSK_SIGNATURE[0];

    // Warn if the deprecated 'random data errors' flag is set
    if (peh->bSides & 0x80)
    {
        Message(msgWarning, "ignoring deprecated 'random data errors' flag");
        peh->bSides &= ~0x80;
    }

    uint8_t cyls = peh->bTracks;
    uint8_t heads = peh->bSides;

    if (heads > MAX_SIDES)
        throw util::exception("invalid head count (", heads, ")");
    else if (cyls > MAX_TRACKS || cyls > max_cyls)
        throw util::exception("invalid cylinder count (", cyls, ")");

    disk->metadata["creator"] = util::trim(std::string(peh->szCreator, sizeof(peh->szCreator)));

    MEMORY mem(ESDK_MAX_TRACK_SIZE);
    bool fWarned6K = false;

    for (uint8_t cyl = 0; cyl < cyls; ++cyl)
    {
        for (uint8_t head = 0; head < heads; ++head)
        {
            CylHead cylhead(cyl, head);
            static const DataRate abEDSKRates[] = { DataRate::_250K, DataRate::_250K, DataRate::_500K, DataRate::_1M };

            // Remember the start position
            auto uTrackStart = file.tell();

            // EDSK supports variable track size, DSK has it fixed for the entire image
            auto uTrackSize = fEDSK ? (pbIndex[cyl * heads + head] << 8) : ((peh->abTrackSize[1] << 8) | peh->abTrackSize[0]);

            // EDSK doesn't store blank tracks, as indicated by zero size in the index
            if (fEDSK && !uTrackSize)
            {
                disk->write(cylhead, Track());
                continue;
            }

            // SugarBox (<= 0.22) doesn't write blank tracks at the end of the disk.
            if (cyl >= 40 && file.tell() == file.size())
            {
                Message(msgWarning, "%s track header is missing, assuming blank track", CH(cyl, head));
                disk->write(cylhead, Track());
                continue;
            }

            EDSK_TRACK th;
            if (!file.read(&th, sizeof(th)))
                throw util::exception("short file reading ", cylhead);

            // Check for "Track-Info", tolerating \r\n missing in bad images (Addams Family)
            if (memcmp(th.signature, EDSK_TRACK_SIG, 10))
                throw util::exception("track signature missing on ", cylhead);

            // Warn if the track sector size is invalid
            if (!fEDSK && th.size > SIZE_MASK_765)
                Message(msgWarning, "invalid sector size code (%s) on %s", SizeStr(th.size), CH(cyl, head));

            if (th.track != cyl || th.side != head)
            {
                if (th.track != cyl) Message(msgWarning, "header track %s != cyl %s", CylStr(th.track), CylStr(cyl));
                else Message(msgWarning, "header side %s != head %s", HeadStr(th.side), HeadStr(head));
            }

            // SAMdisk initially implemented John Elliot's rate+encoding extension in the wrong place.
            // If we find values in the wrong place, and none set in the right place, move them over!
            if (th.rate == 0 && th.unused[0]) { th.rate = th.unused[0]; th.unused[0] = 0; }
            if (th.encoding == 0 && th.unused[1]) { th.encoding = th.unused[1]; th.unused[1] = 0; }

            // Warn if the unused fields are used
            if (th.unused[0] || th.unused[1] || th.unused[2])
                Message(msgWarning, "unused fields are non-zero (%02X %02X %02X) on %s", th.unused[0], th.unused[1], th.unused[2], CH(cyl, head));

            DataRate datarate = (th.rate >= 1 && th.rate <= 3) ? abEDSKRates[th.rate] : DataRate::_250K;
            Encoding encoding = (th.encoding != 1) ? Encoding::MFM : Encoding::FM;
            Track track(th.sectors);

            // Determine the track header size, and the start of the data beyond it
            // Round the header size to the next 256-byte boundary
            int uSectorHeaders = (sizeof(EDSK_TRACK) + th.sectors * sizeof(EDSK_SECTOR) + 0xff) & ~0xff;
            uSectorHeaders -= sizeof(EDSK_TRACK);
            int uMinimum = th.sectors * sizeof(EDSK_SECTOR);

            // CPCDiskXP writes a truncated track header if the final track is blank.
            // Check if only the minimum header size has been supplied.
            if (uMinimum < uSectorHeaders && (file.size() - file.tell()) == uMinimum)
                Message(msgWarning, "%s track header is shorter than index size", CH(cyl, head));
            else if (!file.read(mem, uSectorHeaders))
                throw util::exception("short file reading ", cylhead, " sector headers");

            for (uint8_t sec = 0; sec < th.sectors; ++sec)
            {
                auto ps = &reinterpret_cast<EDSK_SECTOR*>(mem.pb)[sec];
                Sector sector(datarate, encoding, Header(ps->track, ps->side, ps->sector, ps->size));

                // Set gap3 on all but final setor
                if (sec < th.sectors - 1)
                {
                    sector.gap3 = th.gap3;

                    // If the sector uses a default gap3 size, clear it. This allows overrides by stored gap3
                    // in ALLGAPS images, and also prevents the default value showing up in track scans.
                    // If the same image is written back, any unset gap3 will be restored to the same value.
                    if (sector.gap3 == EDSK_DEFAULT_GAP3 || sector.gap3 == CPC_DEFAULT_GAP3)
                        sector.gap3 = 0;
                }

                uint8_t status1 = ps->status1, status2 = ps->status2;
                bool id_crc_error = (status1 & SR1_CRC_ERROR) != 0;
                bool data_not_found = (status2 & SR2_MISSING_ADDRESS_MARK) != 0;
                bool data_crc_error = (status2 & SR2_CRC_ERROR_IN_SECTOR_DATA) != 0;
                bool deleted_dam = (status2 & SR2_SECTOR_WITH_DELETED_DATA) != 0;

                // uPD765 sets both id and data flags for data CRC errors
                if (data_crc_error)
                    id_crc_error = false;
                else if (id_crc_error)
                    sector.set_badidcrc();

                // Check for an impossible flag combo, used for storing placeholder sectors (Logo Professor test)
                if (status1 & SR1_CRC_ERROR && status2 & SR2_MISSING_ADDRESS_MARK)
                {
                    Message(msgWarning, "unsupported placeholder sector on %s", CHSR(cyl, head, sec, sector.header.sector));
                    status2 &= ~SR2_MISSING_ADDRESS_MARK;
                }

                // Check for bits that shouldn't be set in the status bytes
                if ((status1 & (SR1_WRITE_PROTECT_DETECTED | SR1_RESERVED1 | SR1_RESERVED2)) ||
                    (status2 & (SR2_SCAN_COMMAND_FAILED | SR2_SCAN_COMMAND_EQUAL | SR2_RESERVED)))
                {
                    Message(msgWarning, "invalid status (ST1=%02X ST2=%02X) for %s", status1, status2, CHSR(cyl, head, sec, sector.header.sector));

                    // Clear the unexpected bits and continue
                    status1 &= ~(SR1_WRITE_PROTECT_DETECTED | SR1_RESERVED1 | SR1_RESERVED2);
                    status2 &= ~(SR2_SCAN_COMMAND_FAILED | SR2_SCAN_COMMAND_EQUAL | SR2_RESERVED);
                }

                // Match expected flag combinations, to identify unusual combinations that could indicate a bogus dump
                if (!(
                    (status1 == SR1_SUCCESS && status2 == SR2_SUCCESS) ||                   // normal data
                    (status1 == SR1_SUCCESS && status2 == SR2_SECTOR_WITH_DELETED_DATA) ||  // deleted data
                    (status1 == SR1_END_OF_CYLINDER && status2 == SR2_SUCCESS) ||                   // end of track?
                    (status1 == SR1_CRC_ERROR && status2 == SR2_SUCCESS) ||                 // id crc error
                    (status1 == SR1_CRC_ERROR && status2 == SR2_CRC_ERROR_IN_SECTOR_DATA) ||    // normal data CRC error
                    (status1 == SR1_CRC_ERROR && status2 == (SR2_CRC_ERROR_IN_SECTOR_DATA | SR2_SECTOR_WITH_DELETED_DATA)) ||   // deleted data CRC error
                    (status1 == SR1_CANNOT_FIND_ID_ADDRESS && status2 == SR2_MISSING_ADDRESS_MARK) ||       // data field missing (some FDCs set AM in ST1)
                    (status1 == SR1_SUCCESS && status2 == SR2_MISSING_ADDRESS_MARK) ||      // data field missing (some FDCs don't)
                    (status1 == SR1_CANNOT_FIND_SECTOR_ID && status2 == SR2_SUCCESS) ||                 // CHRN mismatch
                    (status1 == SR1_CANNOT_FIND_SECTOR_ID && status2 == SR2_WRONG_CYLINDER_DETECTED)        // CHRN mismatch, including wrong cylinder
                    ))
                {
                    Message(msgWarning, "unusual status flags (ST1=%02X ST2=%02X) for %s", status1, status2, CHSR(cyl, head, sec, sector.header.sector));
                }

                auto native_size = sector.size();
                auto data_size = fEDSK ? (ps->datahigh << 8) | ps->datalow : Sector::SizeCodeToLength(th.size);
                auto num_copies = data_not_found ? 0 : 1;

                // EDSK data field with gap data or multiple copies?
                if (fEDSK && data_size > native_size)
                {
                    // Multiple error copies extension?
                    // Also accept 48K as 3x16K copies, as found in early public test images.
                    if (data_crc_error && ((data_size % native_size) == 0 || data_size == 49152))
                    {
                        // Accept 48K as 3x16K, regardless of native size
                        if (data_size == 49152)
                            num_copies = 3;

                        // Otherwise it's a straight multiple
                        else
                            num_copies = data_size / native_size;

                        // Calculate the size stored for each copy
                        data_size /= num_copies;
                    }
                }

                // Process each copy
                for (auto u = 0; u < num_copies; ++u)
                {
                    // Allocate enough space for the data, with at least the native size
                    Data data(data_size);

                    // Read the data copy
                    if (!file.read(data))
                        throw util::exception("short file reading ", cylhead, " sector ", sector.header.sector);

                    // CPDRead sometimes stores too much data. If we find a data size that is an exact multiple on an
                    // error free sector, trim it down to the natural size.
                    if (opt.fix != 0 && disk->metadata["creator"].substr(0, 3) == "CPD" &&
                        data_size > native_size && !data_crc_error && !(data_size % native_size))
                    {
                        // Example: Discology +3.dsk (SDP)
                        Message(msgFix, "dropping suspicious excess data on %s", CHSR(cyl, head, sec, sector.header.sector));
                        data.resize(native_size);
                    }

                    // Data CRC, size 1 above multiple of native, and dummy marker byte at the end of the data?
                    // ToDo: document horrid hack
                    if (data_crc_error && (data_size % native_size) == 1 && data[data_size - 1] == 123)
                    {
                        // Remove the dummy byte
                        data.resize(--data_size);
                    }

                    // Old-style DSK images have some restrictions
                    if (!fEDSK)
                    {
                        // Sectors without a data field have no data
                        if (id_crc_error || data_not_found)
                            continue;

                        // Gap data is not supported
                        if (data_size > native_size)
                            data.resize(data_size);
                    }

                    if (id_crc_error || data_not_found)
                        Message(msgWarning, "ignoring stored data on %s, which has no data field", CHSR(cyl, head, sec, sector.header.sector));
                    else
                    {
                        auto res = sector.add(std::move(data), data_crc_error, deleted_dam ? 0xf8 : 0xfb);
                        if (res == Sector::Merge::Unchanged)
                            Message(msgInfo, "ignored identical data copy of %s", CHSR(cyl, head, sec, sector.header.sector));
                    }
                }

                track.add(std::move(sector));
            }

            // Calculate the used track size, rounded up to the next 256 bytes
            auto uTrackEnd = (file.tell() + 0xff) & ~0xff;

            // Seek past the size indicated by the index
            file.seek(uTrackStart + uTrackSize);

            // With EDSK images the used size should match what the index says
            if (fEDSK && (uTrackEnd - uTrackStart) != uTrackSize)
            {
                // If the low 16-bits are different, we'll stick with trusting the index size
                if (((uTrackEnd - uTrackStart) & 0xffff) != uTrackSize)
                    Message(msgWarning, "%s size (%u) does not match index entry (%u)", CH(cyl, head), uTrackEnd - uTrackStart, uTrackSize);
                else
                {
                    // The track size probably overflowed (some WinAPE images), so trust the used size
                    Message(msgWarning, "%s size (%u) does not match index entry (%u)", CH(cyl, head), uTrackEnd - uTrackStart, uTrackSize);
                    file.seek(uTrackEnd);
                }
            }

            // Legacy EDSK images only store 6K data for 8K sectors, so any
            // checksum bytes the disk may have had are lost.
            if (!fWarned6K && track.is_8k_sector() && track[0].data_size() == 6144)
            {
                Message(msgWarning, "missing checksums needed to verify 8K sector integrity");
                fWarned6K = true;
            }

            disk->write(cylhead, std::move(track));
        }
    }

    // Check for Offset-Info header at normal file end
    EDSK_OFFSETS eo;
    if (fEDSK && file.read(&eo, sizeof(eo), 1))
    {
        if (!memcmp(eo.signature, EDSK_OFFSETS_SIG, 11))
        {
            Range(cyls, heads).each([&](const CylHead& cylhead) {
                auto track = disk->read_track(cylhead);

                uint16_t val;
                if (file.read(&val, sizeof(val), 1))
                    track.tracklen = util::letoh(val) * 16; // convert to bitstream bits

                for (auto& sector : track.sectors())
                {
                    if (file.read(&val, sizeof(val), 1))
                        sector.offset = util::letoh(val) * 16;  // convert to bitstream bits
                }

                disk->write(cylhead, std::move(track));
                });
        }
        else
        {
            // Undo non-matching read
            file.seek(file.tell() - sizeof(eo));
        }
    }

    // Check for blank track headers that RealSpectrum adds to files, despite the spec saying it shouldn't:
    // "A size of "0" indicates an unformatted track. In this case there is no data, and no track
    //  information block for this track in the image file!"
    EDSK_TRACK* pth = reinterpret_cast<EDSK_TRACK*>(ab);
    while (file.read(ab, sizeof(ab), 1))
    {
        if (!memcmp(pth->signature, EDSK_TRACK_SIG, 10) && !pth->sectors)
        {
            // Example: Fun School 2 For The Over-8s.dsk (SDP +3)
            Message(msgWarning, "blank %s should not have EDSK track block", CH(pth->track, pth->side));
        }
        else
        {
            // Undo non-matching read
            file.seek(file.tell() - sizeof(ab));
            break;
        }
    }

    size_t uTail = file.size() - file.tell();
    if (uTail)
    {
        auto pbTail = file.data().data() + file.tell();

        if (!memcmp(pbTail, pbTail + 1, uTail - 1))
        {
            // Example: Compilation Disk 048 (19xx)(-).zip  (TOSEC CPC Compilations)
            Message(msgWarning, "file ends with %u bytes of %02X filler", uTail, *pbTail);
        }
        else
        {
            // Example: Silva (1985)(Lankhor)(fr)[cr Genesis][t Genesis].zip (TOSEC CPC Games)
            Message(msgWarning, "%u bytes of unused data found at end of file:", uTail);
            util::hex_dump(file.data().begin(), file.data().end(), file.tell());
        }
    }

    disk->strType = "EDSK";
    return true;
}